

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

void Sbd_StoRefObj(Sbd_Sto_t *p,int iObj,int iMirror)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int i;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  Vec_Int_t *pVVar6;
  
  pGVar4 = Gia_ManObj(p->pGia,iObj);
  if (p->vRefs->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vRefs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f1,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  if (iObj <= iMirror) {
    __assert_fail("iMirror < iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f2,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  Vec_IntPush(p->vRefs,0);
  if (0 < iMirror) {
    pVVar6 = p->vRefs;
    iVar1 = Vec_IntEntry(pVVar6,iMirror);
    Vec_IntWriteEntry(pVVar6,iObj,iVar1);
    Vec_IntWriteEntry(p->vRefs,iMirror,1);
  }
  uVar2 = (uint)*(ulong *)pGVar4;
  uVar5 = *(ulong *)pGVar4 & 0x1fffffff;
  if (uVar5 == 0x1fffffff || (int)uVar2 < 0) {
    if (-1 < (int)uVar2 || (int)uVar5 == 0x1fffffff) {
      return;
    }
    iVar1 = Vec_IntEntry(p->vMirrors,iObj - (uVar2 & 0x1fffffff));
    if (iVar1 != -1) {
      __assert_fail("Lit0m == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                    ,0x306,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
    }
    pVVar6 = p->vRefs;
    iVar3 = iObj - (*(uint *)pGVar4 & 0x1fffffff);
    iVar1 = extraout_EDX_01;
  }
  else {
    iVar1 = Vec_IntEntry(p->vMirrors,iObj - (uVar2 & 0x1fffffff));
    iVar3 = Vec_IntEntry(p->vMirrors,iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
    if (iVar1 < 0) {
      i = iObj - (*(uint *)pGVar4 & 0x1fffffff);
      iVar1 = extraout_EDX;
    }
    else {
      i = Abc_Lit2Var(iVar1);
      iVar1 = extraout_EDX_00;
    }
    if (iVar3 < 0) {
      iVar3 = iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
    }
    else {
      iVar3 = Abc_Lit2Var(iVar3);
      iVar1 = extraout_EDX_02;
    }
    Vec_IntAddToEntry(p->vRefs,i,iVar1);
    pVVar6 = p->vRefs;
    iVar1 = extraout_EDX_03;
  }
  Vec_IntAddToEntry(pVVar6,iVar3,iVar1);
  return;
}

Assistant:

void Sbd_StoRefObj( Sbd_Sto_t * p, int iObj, int iMirror )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    assert( iObj == Vec_IntSize(p->vRefs) );
    assert( iMirror < iObj );
    Vec_IntPush( p->vRefs, 0 );
//printf( "Ref %d\n", iObj );
    if ( iMirror > 0 )
    {
        Vec_IntWriteEntry( p->vRefs, iObj, Vec_IntEntry(p->vRefs, iMirror) );
        Vec_IntWriteEntry( p->vRefs, iMirror, 1 );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        int Lit1m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        int Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        int Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Vec_IntAddToEntry( p->vRefs, Fan0, 1 );
        Vec_IntAddToEntry( p->vRefs, Fan1, 1 );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        assert( Lit0m == -1 );
        Vec_IntAddToEntry( p->vRefs, Gia_ObjFaninId0(pObj, iObj), 1 );
    }
}